

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall
DCanvas::VirtualToRealCoordsInt
          (DCanvas *this,int *x,int *y,int *w,int *h,int vwidth,int vheight,bool vbottom,
          bool handleaspect)

{
  double dx;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = (double)*x;
  local_40 = (double)*y;
  local_48 = (double)*w;
  local_50 = (double)*h;
  VirtualToRealCoords(this,&local_38,&local_40,&local_48,&local_50,(double)vwidth,(double)vheight,
                      vbottom,handleaspect);
  *x = (int)(local_38 + 0.5);
  *y = (int)(local_40 + 0.5);
  *w = (int)(local_38 + local_48 + 0.5) - *x;
  *h = (int)(local_40 + local_50 + 0.5) - *y;
  return;
}

Assistant:

void DCanvas::VirtualToRealCoordsInt(int &x, int &y, int &w, int &h,
	int vwidth, int vheight, bool vbottom, bool handleaspect) const
{
	double dx, dy, dw, dh;

	dx = x;
	dy = y;
	dw = w;
	dh = h;
	VirtualToRealCoords(dx, dy, dw, dh, vwidth, vheight, vbottom, handleaspect);
	x = int(dx + 0.5);
	y = int(dy + 0.5);
	w = int(dx + dw + 0.5) - x;
	h = int(dy + dh + 0.5) - y;
}